

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O3

parser_error parse_renderer_code(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *__s2;
  long lVar4;
  backend_info *pbVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s2 = parser_getstr(p,"code");
    pbVar5 = backends;
    lVar4 = 0;
    do {
      iVar1 = strcmp(*(char **)((long)backend_names + lVar4),__s2);
      if (iVar1 == 0) {
        *(backend_info **)((long)pvVar3 + 0x30) = pbVar5;
        return PARSE_ERROR_NONE;
      }
      pbVar5 = pbVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x50);
    pVar2 = PARSE_ERROR_INVALID_VALUE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_renderer_code(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *code;
	int ind;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	code = parser_getstr(p, "code");
	ind = lookup_backend_by_name(code);
	if (ind == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	renderer->backend = backends + ind - 1;
	return PARSE_ERROR_NONE;
}